

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_2::anon_unknown_0::readMultiPart
               (MultiPartInputFile *in,bool reduceMemory,bool reduceTime)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  pointer pfVar5;
  pointer puVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Header *pHVar17;
  uint *puVar18;
  int *piVar19;
  Compression *pCVar20;
  string *psVar21;
  long lVar22;
  _Rb_tree_node_base *p_Var23;
  _Rb_tree_node_base *p_Var24;
  long lVar25;
  void *pvVar26;
  long *plVar27;
  pointer __s;
  void *pvVar28;
  char *pcVar29;
  char *pcVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int y;
  size_t __n;
  long lVar37;
  long lVar38;
  int x;
  long *plVar39;
  ulong uVar40;
  size_type sVar41;
  pointer phVar42;
  long lVar43;
  bool bVar44;
  bool bVar45;
  long local_1a0;
  long local_188;
  InputPart pt;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> halfChannels;
  vector<float,_std::allocator<float>_> floatChannels;
  bool local_118;
  FrameBuffer i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uintChannels;
  DeepFrameBuffer frameBuffer;
  
  iVar8 = Imf_3_2::MultiPartInputFile::parts();
  if (iVar8 < 1) {
    local_118 = false;
  }
  else {
    local_118 = false;
    iVar8 = 0;
    do {
      iVar12 = (int)in;
      pHVar17 = (Header *)Imf_3_2::MultiPartInputFile::header(iVar12);
      cVar7 = Imf_3_2::hasEnvmap(pHVar17);
      if (((cVar7 != '\0') && (puVar18 = (uint *)Imf_3_2::envmap(pHVar17), 1 < *puVar18)) ||
         ((cVar7 = Imf_3_2::hasDeepImageState(pHVar17), cVar7 != '\0' &&
          (puVar18 = (uint *)Imf_3_2::deepImageState(pHVar17), 3 < *puVar18)))) {
        local_118 = true;
      }
      Imf_3_2::MultiPartInputFile::header(iVar12);
      piVar19 = (int *)Imf_3_2::Header::dataWindow();
      iVar36 = *piVar19;
      iVar11 = piVar19[2];
      pHVar17 = (Header *)Imf_3_2::MultiPartInputFile::header(iVar12);
      iVar9 = Imf_3_2::calculateBytesPerPixel(pHVar17);
      Imf_3_2::MultiPartInputFile::header(iVar12);
      pCVar20 = (Compression *)Imf_3_2::Header::compression();
      iVar10 = Imf_3_2::numLinesInBuffer(*pCVar20);
      uVar40 = (((long)iVar11 - (long)iVar36) + 1) * (long)iVar9 * (long)iVar10;
      bVar44 = 8000000 < uVar40;
      Imf_3_2::MultiPartInputFile::header(iVar12);
      psVar21 = (string *)Imf_3_2::Header::type_abi_cxx11_();
      cVar7 = Imf_3_2::isTiled(psVar21);
      bVar45 = true;
      if (cVar7 != '\0') {
        Imf_3_2::MultiPartInputFile::header(iVar12);
        puVar18 = (uint *)Imf_3_2::Header::tileDescription();
        uVar32 = (ulong)*puVar18;
        uVar33 = puVar18[1] * uVar32 * (long)iVar9;
        bVar45 = uVar33 < 0xf4241;
        bVar44 = 8000000 < ((((long)iVar11 - (long)iVar36) + uVar32) / uVar32) * uVar33 ||
                 8000000 < uVar40;
      }
      if ((!reduceMemory) || (!bVar44)) {
        Imf_3_2::InputPart::InputPart(&pt,in,iVar8);
        Imf_3_2::InputPart::header();
        piVar19 = (int *)Imf_3_2::Header::dataWindow();
        iVar12 = piVar19[2];
        iVar36 = *piVar19;
        pHVar17 = (Header *)Imf_3_2::InputPart::header();
        lVar22 = Imf_3_2::calculateBytesPerPixel(pHVar17);
        Imf_3_2::InputPart::header();
        pCVar20 = (Compression *)Imf_3_2::Header::compression();
        iVar11 = Imf_3_2::numLinesInBuffer(*pCVar20);
        sVar41 = ((long)iVar12 - (long)iVar36) + 1;
        if ((!reduceMemory) || (lVar22 * sVar41 * (long)iVar11 < 0x7a1201)) {
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
          i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                    (&halfChannels,sVar41,(allocator_type *)&frameBuffer);
          std::vector<float,_std::allocator<float>_>::vector
                    (&floatChannels,sVar41,(allocator_type *)&frameBuffer);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&uintChannels,sVar41,(allocator_type *)&frameBuffer);
          puVar6 = uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pfVar5 = floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          phVar42 = halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_start;
          Imf_3_2::InputPart::header();
          Imf_3_2::Header::channels();
          p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          uVar40 = 0;
          for (; p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var23 != p_Var24;
              p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
            iVar12 = (int)uVar40 + (int)(uVar40 / 3) * -3;
            if (iVar12 == 2) {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,UINT,
                         (char *)(puVar6 + -(long)(iVar36 / *(int *)&p_Var23[9].field_0x4)),4,0,
                         *(int *)&p_Var23[9].field_0x4,*(int *)&p_Var23[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var23 + 1));
            }
            else if (iVar12 == 1) {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,FLOAT,
                         (char *)(pfVar5 + -(long)(iVar36 / *(int *)&p_Var23[9].field_0x4)),4,0,
                         *(int *)&p_Var23[9].field_0x4,*(int *)&p_Var23[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var23 + 1));
            }
            else {
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,HALF,
                         (char *)(phVar42 + -(long)(iVar36 / *(int *)&p_Var23[9].field_0x4)),2,0,
                         *(int *)&p_Var23[9].field_0x4,*(int *)&p_Var23[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var23 + 1));
            }
            uVar40 = (ulong)((int)uVar40 + 1);
          }
          Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&pt);
          iVar12 = piVar19[1];
          if (iVar12 <= piVar19[3]) {
            do {
              Imf_3_2::InputPart::readPixels((int)&pt);
              bVar4 = iVar12 < piVar19[3];
              iVar12 = iVar12 + 1;
            } while (bVar4);
          }
          if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&i);
        }
      }
      if (bVar45 || !reduceMemory) {
        Imf_3_2::MultiPartInputFile::flushPartCache();
        Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&pt,in,iVar8);
        Imf_3_2::TiledInputPart::header();
        piVar19 = (int *)Imf_3_2::Header::dataWindow();
        iVar12 = piVar19[2];
        iVar36 = *piVar19;
        iVar11 = Imf_3_2::TiledInputPart::numXLevels();
        iVar9 = Imf_3_2::TiledInputPart::numYLevels();
        Imf_3_2::TiledInputPart::header();
        piVar19 = (int *)Imf_3_2::Header::tileDescription();
        pHVar17 = (Header *)Imf_3_2::TiledInputPart::header();
        lVar22 = Imf_3_2::calculateBytesPerPixel(pHVar17);
        sVar41 = ((long)iVar12 - (long)iVar36) + 1;
        if ((!reduceMemory) ||
           ((lVar22 * sVar41 < 0x7a1201 && (lVar22 * (ulong)(uint)(piVar19[1] * *piVar19) < 0xf4241)
            ))) {
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &i._map._M_t._M_impl.super__Rb_tree_header._M_header;
          i._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>::vector
                    (&halfChannels,sVar41,(allocator_type *)&frameBuffer);
          std::vector<float,_std::allocator<float>_>::vector
                    (&floatChannels,sVar41,(allocator_type *)&frameBuffer);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&uintChannels,sVar41,(allocator_type *)&frameBuffer);
          Imf_3_2::TiledInputPart::header();
          Imf_3_2::Header::channels();
          p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          uVar40 = 0;
          for (; p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end(), p_Var23 != p_Var24;
              p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23)) {
            iVar12 = (int)uVar40 + (int)(uVar40 / 3) * -3;
            if (iVar12 == 2) {
LAB_001129a5:
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,UINT,
                         (char *)(uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 -(iVar36 / *(int *)&p_Var23[9].field_0x4)),4,0,
                         *(int *)&p_Var23[9].field_0x4,*(int *)&p_Var23[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var23 + 1));
            }
            else {
              if (iVar12 == 1) {
                Imf_3_2::Slice::Slice
                          ((Slice *)&frameBuffer,FLOAT,
                           (char *)(floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                                   -(iVar36 / *(int *)&p_Var23[9].field_0x4)),4,0,
                           *(int *)&p_Var23[9].field_0x4,*(int *)&p_Var23[9]._M_parent,0.0,false,
                           false);
                Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var23 + 1));
                goto LAB_001129a5;
              }
              Imf_3_2::Slice::Slice
                        ((Slice *)&frameBuffer,HALF,
                         (char *)(halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                                 -(iVar36 / *(int *)&p_Var23[9].field_0x4)),2,0,
                         *(int *)&p_Var23[9].field_0x4,*(int *)&p_Var23[9]._M_parent,0.0,false,false
                        );
              Imf_3_2::FrameBuffer::insert((char *)&i,(Slice *)(p_Var23 + 1));
            }
            uVar40 = (ulong)((int)uVar40 + 1);
          }
          Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&pt);
          iVar12 = 0;
          if (0 < iVar9) {
            do {
              if (0 < iVar11) {
                iVar36 = 0;
                do {
                  for (iVar10 = 0; iVar13 = Imf_3_2::TiledInputPart::numYTiles((int)&pt),
                      iVar10 < iVar13; iVar10 = iVar10 + 1) {
                    for (iVar13 = 0; iVar14 = Imf_3_2::TiledInputPart::numXTiles((int)&pt),
                        iVar13 < iVar14; iVar13 = iVar13 + 1) {
                      Imf_3_2::TiledInputPart::readTile((int)&pt,iVar13,iVar10,iVar36);
                    }
                  }
                  iVar36 = iVar36 + 1;
                } while (iVar36 != iVar11);
              }
              iVar12 = iVar12 + 1;
            } while (iVar12 != iVar9);
          }
          if (uintChannels.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(uintChannels.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)uintChannels.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(floatChannels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)floatChannels.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(halfChannels.
                            super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)halfChannels.
                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                       *)&i);
          goto LAB_00112ddc;
        }
LAB_00112de1:
        if (!bVar44) goto LAB_00112dec;
      }
      else {
LAB_00112ddc:
        if (reduceMemory) goto LAB_00112de1;
LAB_00112dec:
        Imf_3_2::MultiPartInputFile::flushPartCache();
        Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                  ((DeepScanLineInputPart *)&floatChannels,in,iVar8);
        Imf_3_2::DeepScanLineInputPart::header();
        piVar19 = (int *)Imf_3_2::Header::dataWindow();
        iVar12 = piVar19[2];
        lVar22 = (long)*piVar19;
        pHVar17 = (Header *)Imf_3_2::DeepScanLineInputPart::header();
        lVar25 = Imf_3_2::calculateBytesPerPixel(pHVar17);
        uVar32 = (iVar12 - lVar22) + 1;
        uVar40 = uVar32 * 4;
        if ((!reduceMemory) || (uVar40 < 0x7a1201)) {
          Imf_3_2::Header::channels();
          p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          local_188 = 0;
          __n = 0;
          uVar33 = 0;
          while( true ) {
            Imf_3_2::Header::channels();
            p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
            if (p_Var23 == p_Var24) break;
            p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
            uVar33 = uVar33 - 1;
            __n = __n + 0x10;
            local_188 = local_188 + 1;
          }
          if (0x3fffffffffffffff < uVar32) {
            uVar40 = 0xffffffffffffffff;
          }
          pvVar26 = operator_new__(uVar40);
          plVar27 = (long *)operator_new__(__n + 8);
          phVar42 = (pointer)-uVar33;
          *plVar27 = (long)phVar42;
          __s = (pointer)(plVar27 + 1);
          iVar36 = (int)uVar33;
          if (iVar36 != 0) {
            memset(__s,0,__n);
            uVar40 = uVar32 * 8;
            lVar37 = local_188;
            halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
            _M_impl.super__Vector_impl_data._M_start = phVar42;
            halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
            _M_impl.super__Vector_impl_data._M_finish = __s;
            if (0x1fffffffffffffff < uVar32) {
              uVar40 = 0xffffffffffffffff;
            }
            do {
              plVar39 = plVar27 + 2;
              pvVar28 = operator_new__(uVar40);
              if ((void *)*plVar39 != (void *)0x0) {
                operator_delete__((void *)*plVar39);
              }
              plVar27[1] = uVar32;
              *plVar39 = (long)pvVar28;
              lVar37 = lVar37 + -1;
              plVar27 = plVar39;
              phVar42 = halfChannels.
                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              __s = halfChannels.
                    super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                    super__Vector_impl_data._M_finish;
            } while (lVar37 != 0);
          }
          halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl
          .super__Vector_impl_data._M_finish = __s;
          halfChannels.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl
          .super__Vector_impl_data._M_start = phVar42;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false)
          ;
          Imf_3_2::Slice::Slice
                    ((Slice *)&i,UINT,(char *)((long)pvVar26 + lVar22 * -4),4,0,1,1,0.0,false,false)
          ;
          Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
          Imf_3_2::Header::channels();
          p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
          lVar37 = 8;
          while( true ) {
            Imf_3_2::Header::channels();
            p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
            if (p_Var23 == p_Var24) break;
            Imf_3_2::DeepSlice::DeepSlice
                      ((DeepSlice *)&i,FLOAT,
                       (char *)(*(long *)((long)&(halfChannels.
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                         lVar37) + lVar22 * -8),8,0,4,1,1,0.0,false,false);
            Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var23 + 1));
            p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
            lVar37 = lVar37 + 0x10;
          }
          Imf_3_2::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&floatChannels);
          i._map._M_t._M_impl._0_8_ = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          if (piVar19[3] < piVar19[1]) {
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                         *)&frameBuffer);
            Array<Imf_3_2::Array<void_*>_>::~Array((Array<Imf_3_2::Array<void_*>_> *)&halfChannels);
            operator_delete__(pvVar26);
          }
          else {
            lVar37 = (~uVar33 & 0xffffffff) + 1;
            iVar11 = piVar19[1];
            do {
              Imf_3_2::DeepScanLineInputPart::readPixelSampleCounts((int)&floatChannels);
              if (uVar32 == 0) {
                sVar41 = 0;
                lVar43 = 0;
              }
              else {
                uVar40 = 0;
                lVar43 = 0;
                sVar41 = 0;
                do {
                  if (iVar36 != 0) {
                    uVar31 = (ulong)*(uint *)((long)pvVar26 + uVar40 * 4);
                    uVar33 = uVar31;
                    if (1000 < lVar25 * uVar31) {
                      uVar33 = 0;
                    }
                    if (!reduceMemory) {
                      uVar33 = uVar31;
                    }
                    lVar43 = lVar43 + uVar31 * lVar37;
                    sVar41 = sVar41 + uVar33 * lVar37;
                  }
                  uVar40 = uVar40 + 1;
                } while (uVar32 != uVar40);
              }
              if ((!reduceMemory) || (lVar43 + sVar41 < 0x1000)) {
                std::vector<float,_std::allocator<float>_>::resize
                          ((vector<float,_std::allocator<float>_> *)&i,sVar41);
                if (uVar32 != 0) {
                  lVar38 = 0;
                  lVar43 = 0;
                  do {
                    if (iVar36 != 0) {
                      uVar40 = (ulong)*(uint *)((long)pvVar26 + lVar43 * 4);
                      lVar34 = 8;
                      lVar35 = local_188;
                      do {
                        if ((lVar25 * uVar40 < 0x3e9 || !reduceMemory) && uVar40 != 0) {
                          *(long *)(*(long *)((long)&(halfChannels.
                                                                                                            
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                             lVar34) + lVar43 * 8) =
                               lVar38 * 4 + i._map._M_t._M_impl._0_8_;
                          lVar38 = lVar38 + uVar40;
                        }
                        else {
                          *(undefined8 *)
                           (*(long *)((long)&(halfChannels.
                                              super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                              ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                     lVar34) + lVar43 * 8) = 0;
                        }
                        lVar34 = lVar34 + 0x10;
                        lVar35 = lVar35 + -1;
                      } while (lVar35 != 0);
                    }
                    bVar44 = lVar43 != iVar12 - lVar22;
                    lVar43 = lVar43 + 1;
                  } while (bVar44);
                }
                Imf_3_2::DeepScanLineInputPart::readPixels((int)&floatChannels);
              }
              bVar44 = iVar11 < piVar19[3];
              iVar11 = iVar11 + 1;
            } while (bVar44);
            if (i._map._M_t._M_impl._0_8_ != 0) {
              operator_delete((void *)i._map._M_t._M_impl._0_8_,
                              (long)i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                              i._map._M_t._M_impl._0_8_);
            }
            std::
            _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                         *)&frameBuffer);
            Array<Imf_3_2::Array<void_*>_>::~Array((Array<Imf_3_2::Array<void_*>_> *)&halfChannels);
            operator_delete__(pvVar26);
          }
        }
      }
      if (bVar45 || !reduceMemory) {
        Imf_3_2::MultiPartInputFile::flushPartCache();
        Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                  ((DeepTiledInputPart *)&floatChannels,in,iVar8);
        Imf_3_2::DeepTiledInputPart::header();
        pHVar17 = (Header *)Imf_3_2::DeepTiledInputPart::header();
        iVar12 = Imf_3_2::calculateBytesPerPixel(pHVar17);
        Imf_3_2::DeepTiledInputPart::header();
        puVar18 = (uint *)Imf_3_2::Header::tileDescription();
        uVar1 = *puVar18;
        lVar25 = (long)(int)uVar1;
        uVar2 = puVar18[1];
        lVar22 = (long)(int)uVar2;
        iVar36 = Imf_3_2::DeepTiledInputPart::numYLevels();
        iVar11 = Imf_3_2::DeepTiledInputPart::numXLevels();
        uVar32 = lVar22 * lVar25;
        uVar40 = uVar32 * 4;
        if (0x3fffffffffffffff < uVar32) {
          uVar40 = 0xffffffffffffffff;
        }
        pcVar29 = (char *)operator_new__(uVar40);
        Imf_3_2::Header::channels();
        p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        lVar37 = 0;
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var23 == p_Var24) break;
          p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
          lVar37 = lVar37 + 1;
        }
        Array<Imf_3_2::Array2D<float_*>_>::Array
                  ((Array<Imf_3_2::Array2D<float_*>_> *)&halfChannels,lVar37);
        iVar9 = (int)lVar37;
        if (iVar9 != 0) {
          uVar40 = uVar32 * 8;
          if (0x1fffffffffffffff < uVar32) {
            uVar40 = 0xffffffffffffffff;
          }
          lVar38 = 0x10;
          lVar43 = lVar37;
          do {
            phVar42 = halfChannels.
                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            pvVar28 = operator_new__(uVar40);
            pvVar26 = *(void **)((long)&phVar42->_h + lVar38);
            if (pvVar26 != (void *)0x0) {
              operator_delete__(pvVar26);
            }
            *(long *)((long)&phVar42[-8]._h + lVar38) = lVar22;
            *(long *)((long)&phVar42[-4]._h + lVar38) = lVar25;
            *(void **)((long)&phVar42->_h + lVar38) = pvVar28;
            lVar38 = lVar38 + 0x18;
            lVar43 = lVar43 + -1;
          } while (lVar43 != 0);
        }
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        Imf_3_2::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
        Imf_3_2::Slice::Slice((Slice *)&i,UINT,pcVar29,4,lVar25 * 4,1,1,0.0,true,true);
        Imf_3_2::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
        Imf_3_2::Header::channels();
        p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        lVar43 = 0x10;
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var23 == p_Var24) break;
          Imf_3_2::DeepSlice::DeepSlice
                    ((DeepSlice *)&i,FLOAT,
                     *(char **)((long)&(halfChannels.
                                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->_h + lVar43),8,
                     lVar25 * 8,4,1,1,0.0,true,true);
          Imf_3_2::DeepFrameBuffer::insert((char *)&frameBuffer,(DeepSlice *)(p_Var23 + 1));
          p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
          lVar43 = lVar43 + 0x18;
        }
        Imf_3_2::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&floatChannels);
        i._map._M_t._M_impl._0_8_ = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        if (iVar36 < 1) {
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                       *)&frameBuffer);
          Array<Imf_3_2::Array2D<float_*>_>::~Array
                    ((Array<Imf_3_2::Array2D<float_*>_> *)&halfChannels);
          operator_delete__(pcVar29);
        }
        else {
          iVar10 = 0;
          do {
            if (0 < iVar11) {
              iVar13 = 0;
              do {
                for (iVar14 = 0;
                    iVar15 = Imf_3_2::DeepTiledInputPart::numYTiles((int)&floatChannels),
                    iVar14 < iVar15; iVar14 = iVar14 + 1) {
                  for (iVar15 = 0;
                      iVar16 = Imf_3_2::DeepTiledInputPart::numXTiles((int)&floatChannels),
                      iVar15 < iVar16; iVar15 = iVar15 + 1) {
                    Imf_3_2::DeepTiledInputPart::readPixelSampleCounts
                              ((int)&floatChannels,iVar15,iVar14,iVar15,iVar14,iVar13);
                    if (0 < (int)uVar2) {
                      lVar38 = 0;
                      lVar43 = 0;
                      sVar41 = 0;
                      pcVar30 = pcVar29;
                      do {
                        if (0 < (int)uVar1) {
                          uVar40 = 0;
                          do {
                            uVar33 = (ulong)(uint)(iVar9 * *(int *)(pcVar30 + uVar40 * 4));
                            lVar43 = lVar43 + uVar33;
                            uVar32 = 0;
                            if ((uint)(*(int *)(pcVar30 + uVar40 * 4) * iVar12) < 0x1000) {
                              uVar32 = uVar33;
                            }
                            if (!reduceMemory) {
                              uVar32 = uVar33;
                            }
                            sVar41 = sVar41 + uVar32;
                            uVar40 = uVar40 + 1;
                          } while (uVar1 != uVar40);
                        }
                        lVar38 = lVar38 + 1;
                        pcVar30 = pcVar30 + lVar25 * 4;
                      } while (lVar38 != lVar22);
                      if ((sVar41 != 0) &&
                         ((!reduceMemory || ((lVar43 + sVar41) * (long)iVar12 < 1000)))) {
                        std::vector<float,_std::allocator<float>_>::resize
                                  ((vector<float,_std::allocator<float>_> *)&i,sVar41);
                        lVar43 = 0;
                        local_1a0 = 0;
                        do {
                          if (0 < (int)uVar1) {
                            uVar40 = 0;
                            do {
                              if ((reduceMemory) &&
                                 (999 < (uint)(*(int *)(pcVar29 + uVar40 * 4 + lVar43 * lVar25 * 4)
                                              * iVar12))) {
                                if (iVar9 != 0) {
                                  lVar35 = 0x10;
                                  lVar38 = lVar37;
                                  do {
                                    *(undefined8 *)
                                     (*(long *)((long)&halfChannels.
                                                                                                              
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-4]._h
                                               + lVar35) * lVar43 * 8 +
                                      *(long *)((long)&(halfChannels.
                                                                                                                
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->_h +
                                               lVar35) + uVar40 * 8) = 0;
                                    lVar35 = lVar35 + 0x18;
                                    lVar38 = lVar38 + -1;
                                  } while (lVar38 != 0);
                                }
                              }
                              else if (iVar9 != 0) {
                                uVar3 = *(uint *)(pcVar29 + uVar40 * 4 + lVar43 * lVar25 * 4);
                                lVar38 = local_1a0 * 4;
                                local_1a0 = local_1a0 + lVar37 * (ulong)uVar3;
                                lVar34 = 4;
                                lVar35 = lVar37;
                                do {
                                  *(long *)(*(long *)(halfChannels.
                                                                                                            
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar34 * 2 + -4) * lVar43 * 8 +
                                            *(long *)(halfChannels.
                                                                                                            
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar34 * 2) + uVar40 * 8) =
                                       i._map._M_t._M_impl._0_8_ + lVar38;
                                  lVar34 = lVar34 + 6;
                                  lVar38 = lVar38 + (ulong)uVar3 * 4;
                                  lVar35 = lVar35 + -1;
                                } while (lVar35 != 0);
                              }
                              uVar40 = uVar40 + 1;
                            } while (uVar40 != uVar1);
                          }
                          lVar43 = lVar43 + 1;
                        } while (lVar43 != lVar22);
                        Imf_3_2::DeepTiledInputPart::readTile
                                  ((int)&floatChannels,iVar15,iVar14,iVar13);
                      }
                    }
                  }
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 != iVar11);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 != iVar36);
          if (i._map._M_t._M_impl._0_8_ != 0) {
            operator_delete((void *)i._map._M_t._M_impl._0_8_,
                            (long)i._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent -
                            i._map._M_t._M_impl._0_8_);
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
          ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
                       *)&frameBuffer);
          Array<Imf_3_2::Array2D<float_*>_>::~Array
                    ((Array<Imf_3_2::Array2D<float_*>_> *)&halfChannels);
          operator_delete__(pcVar29);
        }
      }
      iVar8 = iVar8 + 1;
      iVar12 = Imf_3_2::MultiPartInputFile::parts();
    } while (iVar8 < iVar12);
  }
  return local_118;
}

Assistant:

bool
readMultiPart (MultiPartInputFile& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    for (int part = 0; part < in.parts (); ++part)
    {

        if (!enumsValid (in.header (part))) { threw = true; }

        bool     widePart      = false;
        bool     largeTiles    = false;
        Box2i    b             = in.header (part).dataWindow ();
        int      bytesPerPixel = calculateBytesPerPixel (in.header (part));
        uint64_t imageWidth    = static_cast<uint64_t> (b.max.x) -
                              static_cast<uint64_t> (b.min.x) + 1ll;
        uint64_t scanlinesInBuffer =
            numLinesInBuffer (in.header (part).compression ());

        //
        // very wide scanline parts take excessive memory to read.
        // compute memory required to store a group of scanlines
        // so tests can be skipped when reduceMemory is set
        //

        if (imageWidth * bytesPerPixel * scanlinesInBuffer >
            gMaxBytesPerScanline)
        {
            widePart = true;
        }
        //
        // significant memory is also required to read a tiled part
        // using the scanline interface with tall tiles - the scanlineAPI
        // needs to allocate memory to store an entire row of tiles
        //
        if (isTiled (in.header (part).type ()))
        {
            const TileDescription& tileDescription =
                in.header (part).tileDescription ();

            uint64_t tilesPerScanline =
                (imageWidth + tileDescription.xSize - 1ll) /
                tileDescription.xSize;
            uint64_t tileSize = static_cast<uint64_t> (tileDescription.xSize) *
                                static_cast<uint64_t> (tileDescription.ySize);

            if (tileSize * tilesPerScanline * bytesPerPixel >
                gMaxTileBytesPerScanline)
            {
                widePart = true;
            }
            if (tileSize * bytesPerPixel > gMaxTileBytes) { largeTiles = true; }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;
            try
            {
                InputPart pt (in, part);
                gotThrow = readScanline (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }
            // only 'DeepTiled' parts are expected to throw
            // all others are an error
            if (gotThrow && in.header (part).type () != DEEPTILE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                TiledInputPart pt (in, part);
                gotThrow = readTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == TILEDIMAGE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !widePart)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepScanLineInputPart pt (in, part);
                gotThrow = readDeepScanLine (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPSCANLINE)
            {
                threw = true;
            }
        }

        if (!reduceMemory || !largeTiles)
        {
            bool gotThrow = false;

            try
            {
                in.flushPartCache ();
                DeepTiledInputPart pt (in, part);
                gotThrow = readDeepTile (pt, reduceMemory, reduceTime);
            }
            catch (...)
            {
                gotThrow = true;
            }

            if (gotThrow && in.header (part).type () == DEEPTILE)
            {
                threw = true;
            }
        }
    }

    return threw;
}